

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.c
# Opt level: O0

float parseReal(char *str,int start,int len)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ushort **ppuVar5;
  char *pcVar6;
  bool bVar7;
  int infract;
  int inside;
  char ch;
  double scale;
  double value;
  int len_local;
  int start_local;
  char *str_local;
  
  scale = 0.0;
  _inside = 1.0;
  bVar3 = false;
  bVar2 = false;
  if ((str == (char *)0x0) || (start < 0)) {
    str_local._4_4_ = 0.0;
  }
  else {
    value._0_4_ = len;
    _len_local = str + start;
    while( true ) {
      iVar4 = value._0_4_ + -1;
      bVar7 = false;
      if (0 < value._0_4_) {
        bVar7 = *_len_local != '\0';
      }
      if (!bVar7) break;
      pcVar6 = _len_local + 1;
      cVar1 = *_len_local;
      value._0_4_ = iVar4;
      _len_local = pcVar6;
      if ((cVar1 < '0') || ('9' < cVar1)) {
        if ((cVar1 != '+') || (bVar3)) {
          if ((cVar1 != '-') || (bVar3)) {
            if ((cVar1 != '.') || (bVar2)) {
              ppuVar5 = __ctype_b_loc();
              if ((((*ppuVar5)[(int)cVar1] & 0x2000) == 0) || (bVar3)) break;
            }
            else {
              bVar2 = true;
            }
          }
          else {
            _inside = -1.0;
            bVar3 = true;
          }
        }
        else {
          bVar3 = true;
        }
      }
      else {
        scale = scale * 10.0 + (double)(cVar1 + -0x30);
        if (bVar2) {
          _inside = _inside * 0.1;
        }
        bVar3 = true;
      }
    }
    str_local._4_4_ = (float)(scale * _inside);
  }
  return str_local._4_4_;
}

Assistant:

float parseReal(char *str, int start, int len) {
   double value = 0.0, scale = 1.0;
   register char ch;
   int inside = 0, infract = 0;

   if (!str || start < 0) { return 0; }
   str += start;

   while((len-- > 0) && *str) {
      ch = *str++;
      if ((ch >='0') && (ch <= '9')) {
	 value = (10.0*value) + (ch - '0');
	 if (infract) { scale *= 0.1; }
	 inside = 1;
      }
      else if (ch == '+' && !inside) {
	 inside = 1;
      }
      else if (ch == '-' && !inside) {
	 scale = -1.0;
	 inside = 1;
      }
      else if (ch == '.' && !infract) {
	 infract = 1;
      }
      else if (isspace(ch) && !inside) { /* nothing */ }
      else break; /* end of real */
   }
   return value*scale;
}